

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcSetExecutorStackSize(uint bytes)

{
  bool bVar1;
  nullres local_9;
  uint bytes_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    local_9 = '\0';
  }
  else {
    bVar1 = ExecutorX86::SetStackSize(NULLC::executorX86,bytes);
    if (bVar1) {
      bVar1 = ExecutorRegVm::SetStackSize(NULLC::executorRegVm,bytes);
      if (bVar1) {
        local_9 = '\x01';
      }
      else {
        local_9 = '\0';
      }
    }
    else {
      local_9 = '\0';
    }
  }
  return local_9;
}

Assistant:

nullres nullcSetExecutorStackSize(unsigned bytes)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

#ifndef NULLC_NO_EXECUTOR

#ifdef NULLC_BUILD_X86_JIT
	if(!executorX86->SetStackSize(bytes))
		return 0;
#endif

#if defined(NULLC_LLVM_SUPPORT)
	if(!executorLLVM->SetStackSize(bytes))
		return 0;
#endif
	if(!executorRegVm->SetStackSize(bytes))
		return 0;
#endif

	(void)bytes;
	return 1;
}